

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

int __thiscall ncnn::Clip::forward_inplace(Clip *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  pvVar7 = bottom_top_blob->data;
  sVar2 = bottom_top_blob->cstep;
  uVar9 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar9;
  }
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar9;
  }
  sVar3 = bottom_top_blob->elemsize;
  for (; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      fVar10 = *(float *)((long)pvVar7 + uVar8 * 4);
      fVar1 = this->min;
      if (fVar10 < fVar1) {
        *(float *)((long)pvVar7 + uVar8 * 4) = fVar1;
        fVar10 = fVar1;
      }
      if (this->max < fVar10) {
        *(float *)((long)pvVar7 + uVar8 * 4) = this->max;
      }
    }
    pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
  }
  return 0;
}

Assistant:

int Clip::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < min)
                ptr[i] = min;
            if (ptr[i] > max)
                ptr[i] = max;
        }
    }

    return 0;
}